

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResultCollector.cpp
# Opt level: O0

void __thiscall tcu::ResultCollector::ResultCollector(ResultCollector *this)

{
  allocator<char> local_25 [20];
  allocator<char> local_11;
  ResultCollector *local_10;
  ResultCollector *this_local;
  
  this->m_log = (TestLog *)0x0;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_prefix,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  this->m_result = QP_TEST_RESULT_LAST;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_message,"Pass",local_25);
  std::allocator<char>::~allocator(local_25);
  return;
}

Assistant:

ResultCollector::ResultCollector (void)
	: m_log		(DE_NULL)
	, m_prefix	("")
	, m_result	(QP_TEST_RESULT_LAST)
	, m_message ("Pass")
{
}